

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ApiSetAuxdata(Fts5Context *pCtx,void *pPtr,_func_void_void_ptr *xDelete)

{
  long lVar1;
  code *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  Fts5Auxdata *pData;
  Fts5Cursor *pCsr;
  int rc;
  sqlite3_int64 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  long *local_38;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_38 = *(long **)(in_RDI + 0x98);
      (local_38 != (long *)0x0 && (*local_38 != *(long *)(in_RDI + 0x90)));
      local_38 = (long *)local_38[3]) {
  }
  if (local_38 == (long *)0x0) {
    local_38 = (long *)sqlite3Fts5MallocZero
                                 ((int *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0),
                                  in_stack_ffffffffffffffb8);
    if (local_38 == (long *)0x0) {
      if (in_RDX != (code *)0x0) {
        (*in_RDX)(in_RSI);
      }
      goto LAB_0028408b;
    }
    *local_38 = *(long *)(in_RDI + 0x90);
    local_38[3] = *(long *)(in_RDI + 0x98);
    *(long **)(in_RDI + 0x98) = local_38;
  }
  else if (local_38[2] != 0) {
    (*(code *)local_38[2])(local_38[1]);
  }
  local_38[2] = (long)in_RDX;
  local_38[1] = in_RSI;
LAB_0028408b:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return 0;
}

Assistant:

static int fts5ApiSetAuxdata(
  Fts5Context *pCtx,              /* Fts5 context */
  void *pPtr,                     /* Pointer to save as auxdata */
  void(*xDelete)(void*)           /* Destructor for pPtr (or NULL) */
){
  Fts5Cursor *pCsr = (Fts5Cursor*)pCtx;
  Fts5Auxdata *pData;

  /* Search through the cursors list of Fts5Auxdata objects for one that
  ** corresponds to the currently executing auxiliary function.  */
  for(pData=pCsr->pAuxdata; pData; pData=pData->pNext){
    if( pData->pAux==pCsr->pAux ) break;
  }

  if( pData ){
    if( pData->xDelete ){
      pData->xDelete(pData->pPtr);
    }
  }else{
    int rc = SQLITE_OK;
    pData = (Fts5Auxdata*)sqlite3Fts5MallocZero(&rc, sizeof(Fts5Auxdata));
    if( pData==0 ){
      if( xDelete ) xDelete(pPtr);
      return rc;
    }
    pData->pAux = pCsr->pAux;
    pData->pNext = pCsr->pAuxdata;
    pCsr->pAuxdata = pData;
  }

  pData->xDelete = xDelete;
  pData->pPtr = pPtr;
  return SQLITE_OK;
}